

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Volume.cpp
# Opt level: O0

error<idx2::mmap_err_code>
idx2::MapVolume(cstr FileName,v3i *Dims3,dtype DType,mmap_volume *Vol,map_mode Mode)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  allocator *paVar4;
  byte *pbVar5;
  i64 iVar6;
  bool bVar7;
  error<idx2::mmap_err_code> eVar8;
  cstr local_110;
  mmap_err_code local_108;
  undefined2 uStack_104;
  anon_class_1_0_00000001 local_f9 [41];
  error<idx2::mmap_err_code> local_d0;
  error<idx2::mmap_err_code> local_c0;
  long local_b0;
  long local_a8;
  long local_a0;
  error<idx2::mmap_err_code> local_98;
  map_mode local_84;
  mmap_volume *pmStack_80;
  map_mode Mode_local;
  mmap_volume *Vol_local;
  v3i *pvStack_70;
  dtype DType_local;
  v3i *Dims3_local;
  cstr FileName_local;
  error<idx2::mmap_err_code> Result;
  int local_48;
  
  local_84 = Mode;
  pmStack_80 = Vol;
  Vol_local._7_1_ = DType;
  pvStack_70 = Dims3;
  Dims3_local = (v3i *)FileName;
  eVar8 = OpenFile(&Vol->MMap,FileName,Mode);
  local_98.Msg = eVar8.Msg;
  FileName_local = local_98.Msg;
  local_98.Code = eVar8.Code;
  Result.Msg._0_4_ = local_98.Code;
  local_98._12_2_ = eVar8._12_2_;
  Result.Msg._4_1_ = local_98.StackIdx;
  Result.Msg._5_1_ = local_98.StrGened;
  local_98 = eVar8;
  bVar7 = ErrorExists<idx2::mmap_err_code>((error<idx2::mmap_err_code> *)&FileName_local);
  if (!bVar7) {
    if (local_84 == Write) {
      local_b0 = (long)(pvStack_70->field_0).field_0.X;
      local_a8 = (long)(pvStack_70->field_0).field_0.Y;
      local_a0 = (long)(pvStack_70->field_0).field_0.Z;
      Result._15_1_ = Vol_local._7_1_;
      switch(Vol_local._7_1_) {
      case int8:
      case uint8:
        local_48 = 1;
        break;
      case int16:
      case uint16:
        local_48 = 2;
        break;
      case int32:
      case uint32:
      case float32:
        local_48 = 4;
        break;
      case int64:
      case uint64:
      case float64:
        local_48 = 8;
        break;
      default:
        local_48 = 0;
      }
      eVar8 = MapFile(&pmStack_80->MMap,local_b0 * local_a8 * local_a0 * (long)local_48);
      local_c0.Msg = eVar8.Msg;
      FileName_local = local_c0.Msg;
      local_c0.Code = eVar8.Code;
      Result.Msg._0_4_ = local_c0.Code;
      local_c0._12_2_ = eVar8._12_2_;
      Result.Msg._4_1_ = local_c0.StackIdx;
      Result.Msg._5_1_ = local_c0.StrGened;
      local_c0 = eVar8;
      bVar7 = ErrorExists<idx2::mmap_err_code>((error<idx2::mmap_err_code> *)&FileName_local);
      if (bVar7) goto LAB_00252786;
    }
    else {
      eVar8 = MapFile(&pmStack_80->MMap,0);
      local_d0.Msg = eVar8.Msg;
      FileName_local = local_d0.Msg;
      local_d0.Code = eVar8.Code;
      Result.Msg._0_4_ = local_d0.Code;
      local_d0._12_2_ = eVar8._12_2_;
      Result.Msg._4_1_ = local_d0.StackIdx;
      Result.Msg._5_1_ = local_d0.StrGened;
      local_d0 = eVar8;
      bVar7 = ErrorExists<idx2::mmap_err_code>((error<idx2::mmap_err_code> *)&FileName_local);
      if (bVar7) goto LAB_00252786;
    }
    paVar4 = (pmStack_80->MMap).Buf.Alloc;
    pbVar5 = (pmStack_80->MMap).Buf.Data;
    iVar6 = (pmStack_80->MMap).Buf.Bytes;
    uVar1 = (pvStack_70->field_0).field_0.X;
    uVar2 = (pvStack_70->field_0).field_0.Y;
    uVar3 = (pvStack_70->field_0).field_0.Z;
    (pmStack_80->Vol).Type = Vol_local._7_1_;
    (pmStack_80->Vol).Buffer.Data = pbVar5;
    (pmStack_80->Vol).Buffer.Bytes = iVar6;
    (pmStack_80->Vol).Buffer.Alloc = paVar4;
    (pmStack_80->Vol).Dims =
         (ulong)(uVar1 & 0x1fffff) | (ulong)(uVar2 & 0x1fffff) << 0x15 |
         (ulong)(uVar3 & 0x1fffff) << 0x2a;
    eVar8 = MapVolume::anon_class_1_0_00000001::operator()(local_f9);
    local_110 = eVar8.Msg;
    FileName_local = local_110;
    local_108 = eVar8.Code;
    Result.Msg._0_4_ = local_108;
    uStack_104 = eVar8._12_2_;
    Result.Msg._4_2_ = uStack_104;
  }
LAB_00252786:
  eVar8.Code = (mmap_err_code)Result.Msg;
  eVar8.Msg = FileName_local;
  eVar8.StackIdx = Result.Msg._4_1_;
  eVar8.StrGened = (bool)Result.Msg._5_1_;
  eVar8._14_2_ = Result.Msg._6_2_;
  return eVar8;
}

Assistant:

error<mmap_err_code>
MapVolume(cstr FileName, const v3i& Dims3, dtype DType, mmap_volume* Vol, map_mode Mode)
{
  idx2_ReturnIfError(OpenFile(&Vol->MMap, FileName, Mode));
  if (Mode == map_mode::Write)
  {
    idx2_ReturnIfError(MapFile(&Vol->MMap, Prod<u64>(Dims3) * SizeOf(DType)));
  }
  else
  {
    idx2_ReturnIfError(MapFile(&Vol->MMap));
  }
  Vol->Vol = volume(Vol->MMap.Buf, Dims3, DType);
  return idx2_Error(mmap_err_code::NoError);
}